

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.cpp
# Opt level: O1

void __thiscall
merlin::gibbs::write_solution
          (gibbs *this,ostream *out,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old2new,graphical_model *orig,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *dummies,
          int output_format)

{
  _Rb_tree_header *p_Var1;
  Type TVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  _Base_ptr p_Var6;
  mapped_type mVar7;
  char cVar8;
  ostream *poVar9;
  double *pdVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  mapped_type *pmVar13;
  runtime_error *this_00;
  _Rb_tree_header *p_Var14;
  mapped_type mVar15;
  double dVar16;
  double dVar17;
  string err_msg;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_70;
  double local_68;
  undefined8 uStack_60;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_70 = evidence;
  if (output_format == 10) {
    TVar2 = (this->m_task).t_;
    cVar8 = (char)out;
    if (TVar2 == MAP) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"MAP",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      local_90[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var1 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var6 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(undefined1 **)(p_Var6 + 1) < local_90[0]]) {
            if (*(undefined1 **)(p_Var6 + 1) >= local_90[0]) {
              p_Var11 = p_Var6;
            }
          }
          p_Var14 = p_Var1;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var14 = (_Rb_tree_header *)p_Var11,
             local_90[0] < (undefined1 *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
            p_Var14 = p_Var1;
          }
          if (p_Var14 == p_Var1) {
            std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::at(local_70,(key_type *)local_90);
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)out);
          }
          local_90[0] = local_90[0] + 1;
        } while (local_90[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      if (TVar2 != MAR) {
        return;
      }
      local_50 = old2new;
      std::__ostream_insert<char,std::char_traits<char>>(out,"MAR",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      local_90[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var1 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var6 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(undefined1 **)(p_Var6 + 1) < local_90[0]]) {
            if (*(undefined1 **)(p_Var6 + 1) >= local_90[0]) {
              p_Var11 = p_Var6;
            }
          }
          p_Var14 = p_Var1;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var14 = (_Rb_tree_header *)p_Var11,
             local_90[0] < (undefined1 *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
            p_Var14 = p_Var1;
          }
          if (p_Var14 == p_Var1) {
            local_48 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)local_90[0]];
            uStack_40 = 0;
            local_68 = local_48 - 9.223372036854776e+18;
            uStack_60 = 0;
            pmVar13 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::at(local_70,(key_type *)local_90);
            mVar7 = *pmVar13;
            std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            uVar12 = (long)local_68 & (long)local_48 >> 0x3f | (long)local_48;
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            if (uVar12 != 0) {
              mVar15 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
                lVar3 = *(long *)out;
                lVar4 = *(long *)(lVar3 + -0x18);
                *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 8) = 6;
                dVar16 = 1.0;
                if (mVar7 != mVar15) {
                  dVar16 = 0.0;
                }
                std::ostream::_M_insert<double>(dVar16);
                mVar15 = mVar15 + 1;
              } while (uVar12 != mVar15);
            }
          }
          local_90[0] = local_90[0] + 1;
        } while (local_90[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
  }
  else {
    if (output_format != 0xb) {
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Unknown output format","")
      ;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)local_90);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(out," \"algorithm\" : \"gibbs\", ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(out," \"samples\" : ",0xd);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    TVar2 = (this->m_task).t_;
    if (TVar2 == MAP) {
      std::__ostream_insert<char,std::char_traits<char>>(out," \"task\" : \"MAP\", ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
      lVar3 = *(long *)out;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 8) = 6;
      local_68 = this->m_lb;
      pdVar10 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pdVar10 == pdVar5) {
        dVar16 = -INFINITY;
      }
      else {
        dVar17 = -INFINITY;
        do {
          dVar16 = *pdVar10;
          if (*pdVar10 <= dVar17) {
            dVar16 = dVar17;
          }
          pdVar10 = pdVar10 + 1;
          dVar17 = dVar16;
        } while (pdVar10 != pdVar5);
      }
      dVar16 = log(dVar16);
      poVar9 = std::ostream::_M_insert<double>(dVar16 + local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"status\" : \"true\", ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"solution\" : [ ",0x10);
      local_90[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var1 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var6 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(undefined1 **)(p_Var6 + 1) < local_90[0]]) {
            if (*(undefined1 **)(p_Var6 + 1) >= local_90[0]) {
              p_Var11 = p_Var6;
            }
          }
          p_Var14 = p_Var1;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var14 = (_Rb_tree_header *)p_Var11,
             local_90[0] < (undefined1 *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
            p_Var14 = p_Var1;
          }
          if (p_Var14 == p_Var1) {
            std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"variable\" : ",0xe);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
            std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::at(local_70,(key_type *)local_90);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
            if (local_90[0] !=
                (undefined1 *)
                (((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
          }
          local_90[0] = local_90[0] + 1;
        } while (local_90[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      if (TVar2 != MAR) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," \"task\" : \"MAR\", ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"value\" : ",0xb);
      lVar3 = *(long *)out;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 8) = 6;
      local_68 = this->m_lb;
      pdVar10 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (orig->m_global_const).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pdVar10 == pdVar5) {
        dVar16 = -INFINITY;
      }
      else {
        dVar17 = -INFINITY;
        do {
          dVar16 = *pdVar10;
          if (*pdVar10 <= dVar17) {
            dVar16 = dVar17;
          }
          pdVar10 = pdVar10 + 1;
          dVar17 = dVar16;
        } while (pdVar10 != pdVar5);
      }
      local_50 = old2new;
      dVar16 = log(dVar16);
      poVar9 = std::ostream::_M_insert<double>(dVar16 + local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"status\" : \"true\", ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(out," \"marginals\" : [ ",0x11);
      local_90[0] = (undefined1 *)0x0;
      if ((orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (orig->m_vadj).
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var1 = &(dummies->_M_t)._M_impl.super__Rb_tree_header;
        do {
          p_Var6 = (dummies->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(undefined1 **)(p_Var6 + 1) < local_90[0]]) {
            if (*(undefined1 **)(p_Var6 + 1) >= local_90[0]) {
              p_Var11 = p_Var6;
            }
          }
          p_Var14 = p_Var1;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var14 = (_Rb_tree_header *)p_Var11,
             local_90[0] < (undefined1 *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
            p_Var14 = p_Var1;
          }
          if (p_Var14 == p_Var1) {
            dVar16 = (orig->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_90[0]];
            uVar12 = (ulong)dVar16;
            uVar12 = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
            std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"variable\" : ",0xe);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"states\" : ",0xc);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out," \"probabilities\" : [",0x14);
            pmVar13 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::at(local_70,(key_type *)local_90);
            if (uVar12 != 0) {
              mVar7 = *pmVar13;
              mVar15 = 0;
              do {
                lVar3 = *(long *)out;
                lVar4 = *(long *)(lVar3 + -0x18);
                *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 8) = 6;
                dVar16 = 1.0;
                if (mVar7 != mVar15) {
                  dVar16 = 0.0;
                }
                std::ostream::_M_insert<double>(dVar16);
                if (uVar12 - 1 != mVar15) {
                  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
                }
                mVar15 = mVar15 + 1;
              } while (uVar12 != mVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
            if (local_90[0] !=
                (undefined1 *)
                (((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
          }
          local_90[0] = local_90[0] + 1;
        } while (local_90[0] <
                 (undefined1 *)
                 ((long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(orig->m_vadj).
                        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"] ",2);
  }
  return;
}

Assistant:

void gibbs::write_solution(std::ostream& out, const std::map<size_t, size_t>& evidence,
		const std::map<size_t, size_t>& old2new, const graphical_model& orig,
		const std::set<size_t>& dummies, int output_format) {

	if (output_format == MERLIN_OUTPUT_JSON) {
		out << "{";
		out << " \"algorithm\" : \"gibbs\", ";
		out << " \"samples\" : " << m_samples.size() << ", ";
		switch (m_task) {
		case Task::MAR:
			{
				out << " \"task\" : \"MAR\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"marginals\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					out << "{";
					out << " \"variable\" : " << v.label() << ", ";
					out << " \"states\" : " << v.states() << ", ";
					out << " \"probabilities\" : [";
					try { // evidence variable
						size_t val = evidence.at(i);
						for (size_t k = 0; k < v.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
							if (k != v.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						for (size_t k = 0; k < VX.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
							if (k != VX.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					}

					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				} // end for
				out << "] ";
				break;
			}
		case Task::MAP:
			{
				out << " \"task\" : \"MAP\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"solution\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					out << "{";
					out << " \"variable\" : " << i << ",";

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " \"value\" : " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " \"value\" : " << m_best_config[j];
					}
					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				}
				out << "] ";
				break;
			}
		default:
			break;
		} // end switch
	} else if (output_format == MERLIN_OUTPUT_UAI) {
		// Ouput marginals (ie, beliefs)
		switch (m_task) {
		case Task::MAR:
			{
				out << "MAR" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << v.states();
						for (size_t k = 0; k < v.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
						}
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						out << " " << VX.states();
						for (size_t k = 0; k < VX.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
						}
					}
				} // end for
				out << std::endl;
				break;
			}
		case Task::MAP:
			{
				out << "MAP" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " " << m_best_config[j];
					}
				}
				out << std::endl;
				break;
			}
		default:
			break;
		} // end switch
	} else {
		std::string err_msg("Unknown output format");
		throw std::runtime_error(err_msg);
	}
}